

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.cpp
# Opt level: O2

void __thiscall Cache::loadBlockFromLowerLevel(Cache *this,uint32_t addr,uint32_t *cycles)

{
  uint32_t *puVar1;
  Cache *this_00;
  uint8_t uVar2;
  uint extraout_EAX;
  uint32_t uVar3;
  long lVar4;
  uint addr_00;
  uint32_t i;
  ulong uVar5;
  double __x;
  allocator_type local_91;
  Block replace_block;
  Block local_60;
  
  __x = 0.0;
  local_60.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uint8_t *)0x0;
  local_60.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.last_reference = 0;
  local_60.valid = true;
  local_60.dirty = false;
  local_60.tag = getTag(this,addr);
  local_60.id = getId(this,addr);
  local_60.size = (this->policy).block_size;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&replace_block,
             (ulong)local_60.size,&local_91);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&local_60.data,&replace_block);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&replace_block);
  log2(__x);
  lVar4 = 0;
  addr_00 = (addr >> (extraout_EAX & 0x1f)) << (extraout_EAX & 0x1f);
  for (uVar5 = (ulong)addr_00; this_00 = this->lower_cache, uVar5 < local_60.size + addr_00;
      uVar5 = uVar5 + 1) {
    if (this_00 == (Cache *)0x0) {
      uVar2 = MemoryManager::getByteNoCache(this->memory,(uint32_t)uVar5);
LAB_00102553:
      local_60.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[lVar4] = uVar2;
    }
    else {
      if (lVar4 != 0) {
        uVar2 = getByteCopy(this_00,(uint32_t)uVar5,(uint32_t *)0x0);
        goto LAB_00102553;
      }
      uVar2 = getByte(this_00,addr_00,cycles);
      *local_60.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start = uVar2;
    }
    lVar4 = lVar4 + 1;
  }
  if (this_00 == (Cache *)0x0) {
    puVar1 = &(this->statistics).cycle_cnt;
    *puVar1 = *puVar1 + 100;
    if (cycles == (uint32_t *)0x0) goto LAB_0010259a;
    uVar3 = 100;
  }
  else {
    uVar3 = (this_00->policy).hit_latency;
    puVar1 = &(this->statistics).cycle_cnt;
    *puVar1 = *puVar1 + uVar3;
    if (cycles == (uint32_t *)0x0) goto LAB_0010259a;
  }
  *cycles = *cycles + uVar3;
LAB_0010259a:
  uVar3 = getReplacementBlockId(this,local_60.id);
  Block::Block(&replace_block,
               (this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar3);
  if (((this->write_back == true) && (replace_block.valid == true)) && (replace_block.dirty == true)
     ) {
    writeBlockToLowerLevel(this,&replace_block,cycles);
  }
  Block::operator=((this->blocks).super__Vector_base<Cache::Block,_std::allocator<Cache::Block>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar3,&local_60);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&replace_block.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_60.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void Cache::loadBlockFromLowerLevel(uint32_t addr, uint32_t *cycles) {
    // get block from memory or lower cache
    Block b;
    b.valid = true;
    b.dirty = false;
    b.tag = this->getTag(addr);
    b.id = this->getId(addr);
    b.size = this->policy.block_size;
    b.data = vector<uint8_t>(b.size);
    uint32_t bits = log2(b.size);
    uint32_t mask = ~((1 << bits) - 1);
    uint32_t block_begin_addr = addr & mask;
    for (uint32_t i = block_begin_addr; i < block_begin_addr + b.size; i++) {
        if (this->lower_cache == nullptr) {
            b.data[i - block_begin_addr] = this->memory->getByteNoCache(i);
        } else {
            if (i == block_begin_addr)
                b.data[i - block_begin_addr] = this->lower_cache->getByte(i, cycles);
            else
                b.data[i - block_begin_addr] = this->lower_cache->getByteCopy(i);
        }
    }
    if (this->lower_cache == nullptr) {
        this->statistics.cycle_cnt += 100;
        if (cycles)
            *cycles += 100;
    } else {
        this->statistics.cycle_cnt += this->lower_cache->policy.hit_latency;
        if (cycles)
            *cycles += this->lower_cache->policy.hit_latency;
    }

    // replace cache

    uint32_t replace_id = this->getReplacementBlockId(b.id);
    Block replace_block = this->blocks[replace_id];
    if (this->write_back && replace_block.valid && replace_block.dirty) {
        this->writeBlockToLowerLevel(replace_block, cycles);
    }
    this->blocks[replace_id] = b;
}